

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O2

void __thiscall HSet::print(HSet *this)

{
  HighsInt ix_2;
  uint uVar1;
  HighsInt ix;
  long lVar2;
  ulong uVar3;
  
  if ((this->setup_ == true) && ((FILE *)this->log_file_ != (FILE *)0x0)) {
    fprintf((FILE *)this->log_file_,"\nSet(%d, %d):\n",
            (ulong)((long)(this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2,(ulong)(uint)this->max_entry_);
    fwrite("Pointers: Pointers|",0x13,1,(FILE *)this->log_file_);
    for (lVar2 = 0; lVar2 <= this->max_entry_; lVar2 = lVar2 + 1) {
      if ((this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar2] != -1) {
        fprintf((FILE *)this->log_file_," %4d");
      }
    }
    fputc(10,(FILE *)this->log_file_);
    fwrite("          Entries |",0x13,1,(FILE *)this->log_file_);
    for (uVar3 = 0; (long)uVar3 <= (long)this->max_entry_; uVar3 = uVar3 + 1) {
      if ((this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] != -1) {
        fprintf((FILE *)this->log_file_," %4d",uVar3 & 0xffffffff);
      }
    }
    fputc(10,(FILE *)this->log_file_);
    fwrite("Entries:  Indices |",0x13,1,(FILE *)this->log_file_);
    for (uVar1 = 0; (int)uVar1 < this->count_; uVar1 = uVar1 + 1) {
      fprintf((FILE *)this->log_file_," %4d",(ulong)uVar1);
    }
    fputc(10,(FILE *)this->log_file_);
    fwrite("          Entries |",0x13,1,(FILE *)this->log_file_);
    for (lVar2 = 0; lVar2 < this->count_; lVar2 = lVar2 + 1) {
      fprintf((FILE *)this->log_file_," %4d",
              (ulong)(uint)(this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar2]);
    }
    fputc(10,(FILE *)this->log_file_);
    return;
  }
  return;
}

Assistant:

void HSet::print() const {
  if (!setup_) return;
  if (log_file_ == NULL) return;
  HighsInt size = entry_.size();
  fprintf(log_file_, "\nSet(%" HIGHSINT_FORMAT ", %" HIGHSINT_FORMAT "):\n",
          size, max_entry_);
  fprintf(log_file_, "Pointers: Pointers|");
  for (HighsInt ix = 0; ix <= max_entry_; ix++) {
    if (pointer_[ix] != no_pointer)
      fprintf(log_file_, " %4" HIGHSINT_FORMAT "", pointer_[ix]);
  }
  fprintf(log_file_, "\n");
  fprintf(log_file_, "          Entries |");
  for (HighsInt ix = 0; ix <= max_entry_; ix++) {
    if (pointer_[ix] != no_pointer)
      fprintf(log_file_, " %4" HIGHSINT_FORMAT "", ix);
  }
  fprintf(log_file_, "\n");
  fprintf(log_file_, "Entries:  Indices |");
  for (HighsInt ix = 0; ix < count_; ix++)
    fprintf(log_file_, " %4" HIGHSINT_FORMAT "", ix);
  fprintf(log_file_, "\n");
  fprintf(log_file_, "          Entries |");
  for (HighsInt ix = 0; ix < count_; ix++)
    fprintf(log_file_, " %4" HIGHSINT_FORMAT "", entry_[ix]);
  fprintf(log_file_, "\n");
}